

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

ssize_t __thiscall
duckdb_parquet::EncryptionWithColumnKey::read
          (EncryptionWithColumnKey *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  uint32_t uVar2;
  uint uVar3;
  TProtocolException *this_00;
  undefined4 in_register_00000034;
  uint32_t _i132;
  TType _etype131;
  uint32_t _size128;
  bool isset_path_in_schema;
  int16_t fid;
  TType ftype;
  string fname;
  uint32_t xfer;
  TInputRecursionTracker tracker;
  undefined4 in_stack_ffffffffffffff38;
  TProtocolExceptionType in_stack_ffffffffffffff3c;
  TProtocol *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  uint32_t in_stack_ffffffffffffff4c;
  uint32_t in_stack_ffffffffffffff50;
  uint32_t in_stack_ffffffffffffff54;
  uint32_t in_stack_ffffffffffffff58;
  uint32_t in_stack_ffffffffffffff5c;
  uint32_t in_stack_ffffffffffffff60;
  uint32_t in_stack_ffffffffffffff64;
  uint local_64;
  uint local_5c;
  short local_46;
  int local_44;
  string local_40 [36];
  uint local_1c;
  undefined8 local_10;
  EncryptionWithColumnKey *local_8;
  
  local_10 = CONCAT44(in_register_00000034,__fd);
  local_8 = this;
  duckdb_apache::thrift::protocol::TInputRecursionTracker::TInputRecursionTracker
            ((TInputRecursionTracker *)in_stack_ffffffffffffff40,
             (TProtocol *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  local_1c = 0;
  std::__cxx11::string::string(local_40);
  uVar2 = duckdb_apache::thrift::protocol::TProtocol::readStructBegin
                    (in_stack_ffffffffffffff40,
                     (string *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  local_1c = uVar2 + local_1c;
  bVar1 = false;
  while( true ) {
    uVar2 = duckdb_apache::thrift::protocol::TProtocol::readFieldBegin
                      ((TProtocol *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       (string *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                       (TType *)in_stack_ffffffffffffff40,
                       (int16_t *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    local_1c = uVar2 + local_1c;
    if (local_44 == 0) break;
    if (local_46 == 1) {
      if (local_44 == 0xf) {
        duckdb::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 *)0x22561d7);
        uVar2 = duckdb_apache::thrift::protocol::TProtocol::readListBegin
                          (in_stack_ffffffffffffff40,
                           (TType *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                           (uint32_t *)0x22561ee);
        local_1c = local_1c + uVar2;
        duckdb::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
        for (local_64 = 0; local_64 < local_5c; local_64 = local_64 + 1) {
          duckdb::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        *)in_stack_ffffffffffffff40,
                       CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
          in_stack_ffffffffffffff64 =
               duckdb_apache::thrift::protocol::TProtocol::readString
                         (in_stack_ffffffffffffff40,
                          (string *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
          local_1c = in_stack_ffffffffffffff64 + local_1c;
        }
        in_stack_ffffffffffffff60 =
             duckdb_apache::thrift::protocol::TProtocol::readListEnd((TProtocol *)0x2256299);
        local_1c = in_stack_ffffffffffffff60 + local_1c;
        bVar1 = true;
      }
      else {
        in_stack_ffffffffffffff5c =
             duckdb_apache::thrift::protocol::TProtocol::skip
                       (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
        local_1c = in_stack_ffffffffffffff5c + local_1c;
      }
    }
    else if (local_46 == 2) {
      if (local_44 == 0xb) {
        in_stack_ffffffffffffff58 =
             duckdb_apache::thrift::protocol::TProtocol::readBinary
                       (in_stack_ffffffffffffff40,
                        (string *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        local_1c = in_stack_ffffffffffffff58 + local_1c;
        this->__isset = (_EncryptionWithColumnKey__isset)((byte)this->__isset & 0xfe | 1);
      }
      else {
        in_stack_ffffffffffffff54 =
             duckdb_apache::thrift::protocol::TProtocol::skip
                       (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
        local_1c = in_stack_ffffffffffffff54 + local_1c;
      }
    }
    else {
      in_stack_ffffffffffffff50 =
           duckdb_apache::thrift::protocol::TProtocol::skip
                     (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
      local_1c = in_stack_ffffffffffffff50 + local_1c;
    }
    in_stack_ffffffffffffff4c =
         duckdb_apache::thrift::protocol::TProtocol::readFieldEnd((TProtocol *)0x225639b);
    local_1c = in_stack_ffffffffffffff4c + local_1c;
  }
  uVar2 = duckdb_apache::thrift::protocol::TProtocol::readStructEnd((TProtocol *)0x22563c5);
  uVar3 = uVar2 + local_1c;
  local_1c = uVar3;
  if (bVar1) {
    std::__cxx11::string::~string(local_40);
    duckdb_apache::thrift::protocol::TInputRecursionTracker::~TInputRecursionTracker
              ((TInputRecursionTracker *)0x225645e);
    return (ulong)uVar3;
  }
  this_00 = (TProtocolException *)__cxa_allocate_exception(0x30);
  duckdb_apache::thrift::protocol::TProtocolException::TProtocolException
            (this_00,in_stack_ffffffffffffff3c);
  __cxa_throw(this_00,&duckdb_apache::thrift::protocol::TProtocolException::typeinfo,
              duckdb_apache::thrift::protocol::TProtocolException::~TProtocolException);
}

Assistant:

uint32_t EncryptionWithColumnKey::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;

  bool isset_path_in_schema = false;

  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 1:
        if (ftype == ::apache::thrift::protocol::T_LIST) {
          {
            this->path_in_schema.clear();
            uint32_t _size128;
            ::apache::thrift::protocol::TType _etype131;
            xfer += iprot->readListBegin(_etype131, _size128);
            this->path_in_schema.resize(_size128);
            uint32_t _i132;
            for (_i132 = 0; _i132 < _size128; ++_i132)
            {
              xfer += iprot->readString(this->path_in_schema[_i132]);
            }
            xfer += iprot->readListEnd();
          }
          isset_path_in_schema = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 2:
        if (ftype == ::apache::thrift::protocol::T_STRING) {
          xfer += iprot->readBinary(this->key_metadata);
          this->__isset.key_metadata = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  if (!isset_path_in_schema)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  return xfer;
}